

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_wrapper.hpp
# Opt level: O2

PyObject *
boost::python::objects::
class_cref_wrapper<GlobalStimulationSettings,_boost::python::objects::make_instance<GlobalStimulationSettings,_boost::python::objects::value_holder<GlobalStimulationSettings>_>_>
::convert(GlobalStimulationSettings *x)

{
  PyObject *pPVar1;
  reference_wrapper<const_GlobalStimulationSettings> local_8;
  
  local_8.t_ = x;
  pPVar1 = make_instance_impl<GlobalStimulationSettings,boost::python::objects::value_holder<GlobalStimulationSettings>,boost::python::objects::make_instance<GlobalStimulationSettings,boost::python::objects::value_holder<GlobalStimulationSettings>>>
           ::execute<boost::reference_wrapper<GlobalStimulationSettings_const>const>(&local_8);
  return pPVar1;
}

Assistant:

static PyObject* convert(Src const& x)
    {
        return MakeInstance::execute(boost::ref(x));
    }